

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O3

void Minisat::sort<Minisat::Lit,Minisat::LessThan_default<Minisat::Lit>>(int *array,ulong param_2)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  
  piVar7 = array;
  if (0xf < (int)param_2) {
    do {
      iVar5 = (int)param_2;
      iVar1 = piVar7[param_2 >> 1 & 0x7fffffff];
      uVar4 = 0xffffffffffffffff;
      param_2 = param_2 & 0xffffffff;
      while( true ) {
        uVar4 = (ulong)(int)uVar4;
        array = piVar7 + uVar4;
        do {
          uVar4 = uVar4 + 1;
          iVar2 = array[1];
          array = array + 1;
        } while (iVar2 < iVar1);
        param_2 = (ulong)(int)param_2;
        do {
          lVar3 = param_2 - 1;
          param_2 = param_2 - 1;
        } while (iVar1 < piVar7[lVar3]);
        if ((long)param_2 <= (long)uVar4) break;
        *array = piVar7[lVar3];
        piVar7[param_2] = iVar2;
      }
      sort<Minisat::Lit,Minisat::LessThan_default<Minisat::Lit>>(piVar7,uVar4 & 0xffffffff);
      uVar6 = iVar5 - (int)uVar4;
      param_2 = (ulong)uVar6;
      piVar7 = array;
    } while (0xf < (int)uVar6);
    param_2 = (ulong)(uint)(iVar5 - (int)uVar4);
  }
  selectionSort<Minisat::Lit,Minisat::LessThan_default<Minisat::Lit>>(array,param_2);
  return;
}

Assistant:

void sort(T* array, int size, LessThan lt)
{
    if (size <= 15)
        selectionSort(array, size, lt);

    else{
        T           pivot = array[size / 2];
        T           tmp;
        int         i = -1;
        int         j = size;

        for(;;){
            do i++; while(lt(array[i], pivot));
            do j--; while(lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i]; array[i] = array[j]; array[j] = tmp;
        }

        sort(array    , i     , lt);
        sort(&array[i], size-i, lt);
    }
}